

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O3

void __thiscall
luna::LexException::LexException<char_const(&)[49]>
          (LexException *this,char *module,int line,int column,char (*args) [49])

{
  char local_2b [3];
  int column_local;
  int line_local;
  char *module_local;
  
  (this->super_Exception).what_._M_dataplus._M_p = (pointer)&(this->super_Exception).what_.field_2;
  (this->super_Exception).what_._M_string_length = 0;
  (this->super_Exception).what_.field_2._M_local_buf[0] = '\0';
  local_2b[2] = 0x3a;
  local_2b[1] = 0x3a;
  local_2b[0] = ' ';
  column_local = column;
  line_local = line;
  module_local = module;
  Exception::SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[49]>
            (&this->super_Exception,&module_local,local_2b + 2,&line_local,local_2b + 1,
             &column_local,local_2b,args);
  return;
}

Assistant:

LexException(const char *module, int line, int column, Args&&... args)
        {
            SetWhat(module, ':', line, ':', column, ' ',
                    std::forward<Args>(args)...);
        }